

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O2

LY_ERR lysp_stmt_minelements
                 (lysp_ctx *ctx,lysp_stmt *stmt,uint32_t *min,uint16_t *flags,
                 lysp_ext_instance **exts)

{
  lysp_stmt *stmt_00;
  LY_ERR LVar1;
  size_t sVar2;
  ushort **ppuVar3;
  int *piVar4;
  ulonglong uVar5;
  char *pcVar6;
  char *format;
  int iVar7;
  ly_ctx *plVar8;
  lysp_stmt **pplVar9;
  char *ptr;
  
  if ((*flags >> 9 & 1) != 0) {
    if (ctx == (lysp_ctx *)0x0) {
      plVar8 = (ly_ctx *)0x0;
    }
    else {
      plVar8 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,"Duplicate keyword \"%s\".","min-elements");
    return LY_EVALID;
  }
  *flags = *flags | 0x200;
  LVar1 = lysp_stmt_validate_value(ctx,Y_STR_ARG,stmt->arg);
  if (LVar1 != LY_SUCCESS) {
    return LVar1;
  }
  pcVar6 = stmt->arg;
  sVar2 = strlen(pcVar6);
  iVar7 = (int)sVar2;
  if (iVar7 != 0) {
    ppuVar3 = __ctype_b_loc();
    if (((*(byte *)((long)*ppuVar3 + (long)*pcVar6 * 2 + 1) & 8) != 0) &&
       (iVar7 < 2 || *pcVar6 != '0')) {
      piVar4 = __errno_location();
      *piVar4 = 0;
      uVar5 = strtoull(pcVar6,&ptr,10);
      pcVar6 = stmt->arg;
      if ((long)ptr - (long)pcVar6 == (long)iVar7) {
        if (uVar5 >> 0x20 == 0 && *piVar4 != 0x22) {
          *min = (uint32_t)uVar5;
          pplVar9 = &stmt->child;
          while( true ) {
            stmt_00 = *pplVar9;
            if (stmt_00 == (lysp_stmt *)0x0) {
              return LY_SUCCESS;
            }
            if (stmt_00->kw != LY_STMT_EXTENSION_INSTANCE) break;
            LVar1 = lysp_stmt_ext(ctx,stmt_00,LY_STMT_MIN_ELEMENTS,0,exts);
            pplVar9 = &stmt_00->next;
            if (LVar1 != LY_SUCCESS) {
              return LVar1;
            }
          }
          if (ctx == (lysp_ctx *)0x0) {
            plVar8 = (ly_ctx *)0x0;
          }
          else {
            plVar8 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          pcVar6 = lyplg_ext_stmt2str(stmt_00->kw);
          ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid keyword \"%s\" as a child of \"%s\"."
                  ,pcVar6,"min-elements");
          return LY_EVALID;
        }
        if (ctx == (lysp_ctx *)0x0) {
          plVar8 = (ly_ctx *)0x0;
        }
        else {
          plVar8 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        format = "Value \"%.*s\" is out of \"%s\" bounds.";
      }
      else {
        if (ctx == (lysp_ctx *)0x0) {
          plVar8 = (ly_ctx *)0x0;
        }
        else {
          plVar8 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        format = "Invalid value \"%.*s\" of \"%s\".";
      }
      goto LAB_0016867e;
    }
  }
  if (ctx == (lysp_ctx *)0x0) {
    plVar8 = (ly_ctx *)0x0;
  }
  else {
    plVar8 = (ly_ctx *)
             **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
  }
  format = "Invalid value \"%.*s\" of \"%s\".";
LAB_0016867e:
  ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,format,sVar2 & 0xffffffff,pcVar6,"min-elements");
  return LY_EVALID;
}

Assistant:

static LY_ERR
lysp_stmt_minelements(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, uint32_t *min, uint16_t *flags,
        struct lysp_ext_instance **exts)
{
    int arg_len;
    char *ptr;
    unsigned long long num;

    if (*flags & LYS_SET_MIN) {
        LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, "min-elements");
        return LY_EVALID;
    }
    *flags |= LYS_SET_MIN;

    /* get value */
    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_STR_ARG, stmt->arg));
    arg_len = strlen(stmt->arg);

    if (!arg_len || !isdigit(stmt->arg[0]) || ((stmt->arg[0] == '0') && (arg_len > 1))) {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, arg_len, stmt->arg, "min-elements");
        return LY_EVALID;
    }

    errno = 0;
    num = strtoull(stmt->arg, &ptr, LY_BASE_DEC);
    /* we have not parsed the whole argument */
    if (ptr - stmt->arg != arg_len) {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, arg_len, stmt->arg, "min-elements");
        return LY_EVALID;
    }
    if ((errno == ERANGE) || (num > UINT32_MAX)) {
        LOGVAL_PARSER(ctx, LY_VCODE_OOB, arg_len, stmt->arg, "min-elements");
        return LY_EVALID;
    }
    *min = num;

    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, LY_STMT_MIN_ELEMENTS, 0, exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), "min-elements");
            return LY_EVALID;
        }
    }

    return LY_SUCCESS;
}